

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::apply_settings
          (session_handle *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *s)

{
  undefined1 local_28 [8];
  shared_ptr<libtorrent::settings_pack> copy;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *s_local;
  session_handle *this_local;
  
  copy.super___shared_ptr<libtorrent::settings_pack,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)s;
  ::std::make_shared<libtorrent::settings_pack,libtorrent::settings_pack>
            ((vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
             local_28);
  async_call<void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&>
            (this,0x169,(shared_ptr<libtorrent::settings_pack> *)0x0);
  ::std::shared_ptr<libtorrent::settings_pack>::~shared_ptr
            ((shared_ptr<libtorrent::settings_pack> *)local_28);
  return;
}

Assistant:

void session_handle::apply_settings(settings_pack&& s)
	{
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::out_enc_policy)
			|| s.get_int(settings_pack::out_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::in_enc_policy)
			|| s.get_int(settings_pack::in_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::allowed_enc_level)
			|| s.get_int(settings_pack::allowed_enc_level)
				<= settings_pack::pe_both);

		auto copy = std::make_shared<settings_pack>(std::move(s));
		async_call(&session_impl::apply_settings_pack, copy);
	}